

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O3

int __thiscall ninx::lexer::Reader::get_next_limiter(Reader *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  do {
    iVar3 = std::istream::peek();
    if (iVar3 < 0) {
      return -1;
    }
    if (iVar3 != 0x2f) {
      if (iVar3 == 0x5c) {
        return -2;
      }
      if (iVar3 == 0x2d) {
        std::istream::get();
        iVar3 = std::istream::peek();
        if (iVar3 - 0x30U < 10) {
          std::istream::seekg((long)this->stream,~_S_beg);
          return -2;
        }
        ignore_spaces(this);
        return 0x2d;
      }
      break;
    }
    bVar2 = ignore_comment(this);
  } while (bVar2);
  lVar4 = 0;
  do {
    pcVar1 = &LIMITER_CHARS + lVar4;
    if (*pcVar1 == (char)iVar3) break;
    bVar2 = lVar4 != 0x11;
    lVar4 = lVar4 + 1;
  } while (bVar2);
  iVar5 = -2;
  if (*pcVar1 == (char)iVar3) {
    std::istream::get();
    if (iVar3 == 0x3d) {
      ignore_spaces(this);
      iVar5 = 0x3d;
    }
    else if (iVar3 == 0x7d) {
      ignore_spaces(this);
      iVar5 = 0x7d;
    }
    else {
      iVar5 = iVar3;
      if (iVar3 == 0x7b) {
        ignore_spaces_and_newline(this,-1);
        iVar5 = 0x7b;
      }
    }
  }
  return iVar5;
}

Assistant:

int ninx::lexer::Reader::get_next_limiter() {
    int next_char = this->stream.peek();
    if (next_char >= 0) {
        if (next_char == '\\') {  // Escape char check
            return FOUND_TEXT;
        }else{
            if(next_char == '-') {  // Negative number handling
                this->stream.get();

                // Check if the next entry is a digit
                if (isdigit(this->stream.peek())) {
                    this->stream.seekg(-1, std::ios_base::cur);
                    return FOUND_TEXT;
                }

                // Also ignore the trailing spaces
                this->ignore_spaces();

                return next_char;
            }

            if (next_char == '/') {  // Comments handling
                bool comments_ignored { this->ignore_comment() };
                if (comments_ignored) {
                    return this->get_next_limiter();
                }
            }

            // Check if the char is a limiter
            if (is_limiter(static_cast<char>(next_char))) {
                // If the char is a limiter, consume it
                this->stream.get();

                // Also ignore the trailing spaces
                // Check if it is the beginning of a block, in that case remove also the new lines
                if (next_char == '{') {
                    this->ignore_spaces_and_newline();
                }else if (next_char == '}') {
                    this->ignore_spaces();
                }else if (next_char == '='){
                    this->ignore_spaces();
                }

                return next_char;
            }else{
                return FOUND_TEXT;
            }
        }
    }else{  // EOF
        return FOUND_EOF;
    }
}